

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::SingleThreadRenderCase::executeForContexts
          (SingleThreadRenderCase *this,EGLDisplay display,EGLSurface surface,Config *config,
          vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts)

{
  allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_> *this_00;
  bool bVar1;
  EGLint EVar2;
  EGLint height_00;
  deInt32 a;
  deUint32 dVar3;
  deUint32 dVar4;
  deBool dVar5;
  Library *egl_00;
  size_type sVar6;
  TestLog *this_01;
  char *str;
  MessageBuilder *pMVar7;
  reference drawOp_00;
  const_reference pvVar8;
  Program *pPVar9;
  reference pvVar10;
  undefined1 local_c20 [7];
  bool imagesOk;
  void *local_bf8;
  EGLContext context_3;
  reference pvStack_be8;
  EGLint api_3;
  DrawPrimitiveOp *drawOp_1;
  void *pvStack_bd8;
  int drawNdx;
  EGLContext context_2;
  int local_bc8;
  EGLint api_2;
  int ctxNdx_1;
  int iterNdx;
  EGLContext context_1;
  undefined1 local_bb0 [4];
  EGLint api_1;
  void *local_ba0;
  EGLContext context;
  EGLint api;
  int ctxNdx;
  __normal_iterator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
  local_b88;
  iterator drawOp;
  MessageBuilder local_a00;
  MessageBuilder local_880;
  MessageBuilder local_700;
  MessageBuilder local_580;
  MessageBuilder local_400;
  MessageBuilder local_280;
  undefined1 local_100 [8];
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  drawOps;
  undefined1 local_e0 [8];
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  programs;
  Random rnd;
  undefined1 local_a8 [8];
  Surface frame;
  Surface refFrame;
  TestLog *log;
  EGLint local_68;
  int numSamples;
  int stencilBits;
  int depthBits;
  PixelFormat pixelFmt;
  float threshold;
  int numIters;
  int drawsPerCtx;
  int numContexts;
  int height;
  int width;
  Library *egl;
  vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts_local;
  Config *config_local;
  EGLSurface surface_local;
  EGLDisplay display_local;
  SingleThreadRenderCase *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                      super_TestCase.m_eglTestCtx);
  EVar2 = eglu::querySurfaceInt(egl_00,display,surface,0x3057);
  height_00 = eglu::querySurfaceInt(egl_00,display,surface,0x3056);
  sVar6 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::size
                    (contexts);
  a = (deInt32)sVar6;
  pixelFmt.alphaBits = 2;
  pixelFmt.blueBits = 0x3ca3d70a;
  _stencilBits = anon_unknown_4::getPixelFormat(egl_00,display,config->config);
  numSamples = eglu::getConfigAttribInt(egl_00,display,config->config,0x3025);
  local_68 = eglu::getConfigAttribInt(egl_00,display,config->config,0x3026);
  log._4_4_ = eglu::getConfigAttribInt(egl_00,display,config->config,0x3031);
  this_01 = tcu::TestContext::getLog
                      ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                       super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::Surface::Surface((Surface *)&frame.m_pixels.m_cap,EVar2,height_00);
  tcu::Surface::Surface((Surface *)local_a8,EVar2,height_00);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  dVar4 = ::deInt32Hash(a);
  de::Random::Random((Random *)
                     ((long)&programs.
                             super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),dVar3 ^ dVar4);
  sVar6 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::size
                    (contexts);
  this_00 = (allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_> *)
            ((long)&drawOps.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>::allocator(this_00);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::vector((vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
            *)local_e0,sVar6,this_00);
  std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>::~allocator
            ((allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_> *)
             ((long)&drawOps.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
            *)local_100);
  tcu::TestLog::operator<<(&local_280,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_280,(char (*) [16])"EGL_RED_SIZE = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stencilBits);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_280);
  tcu::TestLog::operator<<(&local_400,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_400,(char (*) [18])"EGL_GREEN_SIZE = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&depthBits);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_400);
  tcu::TestLog::operator<<(&local_580,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_580,(char (*) [17])"EGL_BLUE_SIZE = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&pixelFmt.redBits);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_580);
  tcu::TestLog::operator<<(&local_700,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_700,(char (*) [18])"EGL_ALPHA_SIZE = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&pixelFmt.greenBits);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_700);
  tcu::TestLog::operator<<(&local_880,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_880,(char (*) [18])"EGL_DEPTH_SIZE = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&numSamples);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_880);
  tcu::TestLog::operator<<(&local_a00,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_a00,(char (*) [20])"EGL_STENCIL_SIZE = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_68);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a00);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&drawOp,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&drawOp,(char (*) [15])"EGL_SAMPLES = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&log + 4));
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&drawOp);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ::resize((vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
            *)local_100,(long)(a << 2));
  local_b88._M_current =
       (DrawPrimitiveOp *)
       std::
       vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
       ::begin((vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                *)local_100);
  while( true ) {
    _api = std::
           vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
           ::end((vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                  *)local_100);
    bVar1 = __gnu_cxx::operator!=
                      (&local_b88,
                       (__normal_iterator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
                        *)&api);
    if (!bVar1) break;
    drawOp_00 = __gnu_cxx::
                __normal_iterator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
                ::operator*(&local_b88);
    anon_unknown_4::randomizeDrawOp
              ((Random *)
               ((long)&programs.
                       super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),drawOp_00);
    __gnu_cxx::
    __normal_iterator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
    ::operator++(&local_b88);
  }
  for (context._4_4_ = 0; context._4_4_ < a; context._4_4_ = context._4_4_ + 1) {
    pvVar8 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
             operator[](contexts,(long)context._4_4_);
    context._0_4_ = pvVar8->first;
    pvVar8 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
             operator[](contexts,(long)context._4_4_);
    local_ba0 = pvVar8->second;
    do {
      (*egl_00->_vptr_Library[0x27])(egl_00,display,surface,surface,local_ba0);
      dVar3 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar3,"makeCurrent(display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x2e2);
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    pPVar9 = anon_unknown_4::createProgram(&this->m_gl,(int)context);
    de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::SharedPtr
              ((SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)local_bb0,pPVar9);
    pvVar10 = std::
              vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
              ::operator[]((vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                            *)local_e0,(long)context._4_4_);
    de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::operator=
              (pvVar10,(SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)local_bb0);
    de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::~SharedPtr
              ((SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)local_bb0);
    pvVar10 = std::
              vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
              ::operator[]((vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                            *)local_e0,(long)context._4_4_);
    pPVar9 = de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::operator->(pvVar10);
    (*pPVar9->_vptr_Program[2])();
  }
  pvVar8 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::operator[]
                     (contexts,0);
  context_1._4_4_ = pvVar8->first;
  pvVar8 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::operator[]
                     (contexts,0);
  _ctxNdx_1 = pvVar8->second;
  do {
    (*egl_00->_vptr_Library[0x27])(egl_00,display,surface,surface,_ctxNdx_1);
    dVar3 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"makeCurrent(display, surface, surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x2ed);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  anon_unknown_4::clear(&this->m_gl,context_1._4_4_,(Vec4 *)CLEAR_COLOR,1.0,0);
  anon_unknown_4::finish(&this->m_gl,context_1._4_4_);
  for (api_2 = 0; api_2 < 2; api_2 = api_2 + 1) {
    for (local_bc8 = 0; local_bc8 < a; local_bc8 = local_bc8 + 1) {
      pvVar8 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
               operator[](contexts,(long)local_bc8);
      context_2._4_4_ = pvVar8->first;
      pvVar8 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
               operator[](contexts,(long)local_bc8);
      pvStack_bd8 = pvVar8->second;
      do {
        (*egl_00->_vptr_Library[0x27])(egl_00,display,surface,surface,pvStack_bd8);
        dVar3 = (*egl_00->_vptr_Library[0x1f])();
        eglu::checkError(dVar3,"makeCurrent(display, surface, surface, context)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                         ,0x2fb);
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      for (drawOp_1._4_4_ = 0; drawOp_1._4_4_ < 2; drawOp_1._4_4_ = drawOp_1._4_4_ + 1) {
        pvStack_be8 = std::
                      vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                      ::operator[]((vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                                    *)local_100,
                                   (long)(local_bc8 * 2 + api_2 * a * 2 + drawOp_1._4_4_));
        EVar2 = context_2._4_4_;
        pvVar10 = std::
                  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                  ::operator[]((vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                *)local_e0,(long)local_bc8);
        pPVar9 = de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::operator*(pvVar10);
        anon_unknown_4::draw(&this->m_gl,EVar2,pPVar9,pvStack_be8);
      }
      anon_unknown_4::finish(&this->m_gl,context_2._4_4_);
    }
  }
  pvVar8 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::operator[]
                     (contexts,0);
  context_3._4_4_ = pvVar8->first;
  pvVar8 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::operator[]
                     (contexts,0);
  local_bf8 = pvVar8->second;
  do {
    (*egl_00->_vptr_Library[0x27])(egl_00,display,surface,surface,local_bf8);
    dVar3 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"makeCurrent(display, surface, surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x30c);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  anon_unknown_4::readPixels(&this->m_gl,context_3._4_4_,(Surface *)local_a8);
  do {
    (*egl_00->_vptr_Library[0x27])(egl_00,display,0,0);
    dVar3 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x311);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  tcu::Surface::getAccess((PixelBufferAccess *)local_c20,(Surface *)&frame.m_pixels.m_cap);
  anon_unknown_4::renderReference
            ((PixelBufferAccess *)local_c20,
             (vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
              *)local_100,(PixelFormat *)&stencilBits,numSamples,local_68,1);
  bVar1 = tcu::fuzzyCompare(this_01,"ComparisonResult","Image comparison result",
                            (Surface *)&frame.m_pixels.m_cap,(Surface *)local_a8,0.02,
                            COMPARE_LOG_RESULT);
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ::~vector((vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
             *)local_100);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::~vector((vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
             *)local_e0);
  de::Random::~Random((Random *)
                      ((long)&programs.
                              super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  tcu::Surface::~Surface((Surface *)local_a8);
  tcu::Surface::~Surface((Surface *)&frame.m_pixels.m_cap);
  return;
}

Assistant:

void SingleThreadRenderCase::executeForContexts (EGLDisplay display, EGLSurface surface, const Config& config, const std::vector<std::pair<EGLint, EGLContext> >& contexts)
{
	const Library&			egl			= m_eglTestCtx.getLibrary();
	const int				width		= eglu::querySurfaceInt(egl, display, surface, EGL_WIDTH);
	const int				height		= eglu::querySurfaceInt(egl, display, surface, EGL_HEIGHT);
	const int				numContexts	= (int)contexts.size();
	const int				drawsPerCtx	= 2;
	const int				numIters	= 2;
	const float				threshold	= 0.02f;

	const tcu::PixelFormat	pixelFmt	= getPixelFormat(egl, display, config.config);
	const int				depthBits	= eglu::getConfigAttribInt(egl, display, config.config, EGL_DEPTH_SIZE);
	const int				stencilBits	= eglu::getConfigAttribInt(egl, display, config.config, EGL_STENCIL_SIZE);
	const int				numSamples	= eglu::getConfigAttribInt(egl, display, config.config, EGL_SAMPLES);

	TestLog&				log			= m_testCtx.getLog();

	tcu::Surface			refFrame	(width, height);
	tcu::Surface			frame		(width, height);

	de::Random				rnd			(deStringHash(getName()) ^ deInt32Hash(numContexts));
	vector<ProgramSp>		programs	(contexts.size());
	vector<DrawPrimitiveOp>	drawOps;

	// Log basic information about config.
	log << TestLog::Message << "EGL_RED_SIZE = "		<< pixelFmt.redBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_GREEN_SIZE = "		<< pixelFmt.greenBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_BLUE_SIZE = "		<< pixelFmt.blueBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_ALPHA_SIZE = "		<< pixelFmt.alphaBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_DEPTH_SIZE = "		<< depthBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_STENCIL_SIZE = "	<< stencilBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_SAMPLES = "			<< numSamples << TestLog::EndMessage;

	// Generate draw ops.
	drawOps.resize(numContexts*drawsPerCtx*numIters);
	for (vector<DrawPrimitiveOp>::iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); ++drawOp)
		randomizeDrawOp(rnd, *drawOp);

	// Create and setup programs per context
	for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
	{
		EGLint		api			= contexts[ctxNdx].first;
		EGLContext	context		= contexts[ctxNdx].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		programs[ctxNdx] = ProgramSp(createProgram(m_gl, api));
		programs[ctxNdx]->setup();
	}

	// Clear to black using first context.
	{
		EGLint		api			= contexts[0].first;
		EGLContext	context		= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		clear(m_gl, api, CLEAR_COLOR, CLEAR_DEPTH, CLEAR_STENCIL);
		finish(m_gl, api);
	}

	// Render.
	for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
	{
		for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
		{
			EGLint		api			= contexts[ctxNdx].first;
			EGLContext	context		= contexts[ctxNdx].second;

			EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

			for (int drawNdx = 0; drawNdx < drawsPerCtx; drawNdx++)
			{
				const DrawPrimitiveOp& drawOp = drawOps[iterNdx*numContexts*drawsPerCtx + ctxNdx*drawsPerCtx + drawNdx];
				draw(m_gl, api, *programs[ctxNdx], drawOp);
			}

			finish(m_gl, api);
		}
	}

	// Read pixels using first context. \todo [pyry] Randomize?
	{
		EGLint		api		= contexts[0].first;
		EGLContext	context	= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		readPixels(m_gl, api, frame);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

	// Render reference.
	// \note Reference image is always generated using single-sampling.
	renderReference(refFrame.getAccess(), drawOps, pixelFmt, depthBits, stencilBits, 1);

	// Compare images
	{
		bool imagesOk = tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, frame, threshold, tcu::COMPARE_LOG_RESULT);

		if (!imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}
}